

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O2

void __thiscall FIX::HttpMessage::setString(HttpMessage *this,string *string)

{
  long lVar1;
  mapped_type *pmVar2;
  InvalidMessage *pIVar3;
  string parameters;
  string key;
  string line;
  string value;
  
  clear(this);
  lVar1 = std::__cxx11::string::find((char *)string,0x1d00b5);
  if (lVar1 == -1) {
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line,"",(allocator<char> *)&parameters);
    InvalidMessage::InvalidMessage(pIVar3,&line);
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  std::__cxx11::string::substr((ulong)&line,(ulong)string);
  lVar1 = std::__cxx11::string::find((char *)&line,0x1c9c94);
  if (lVar1 != 0) {
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameters,"",(allocator<char> *)&key);
    InvalidMessage::InvalidMessage(pIVar3,&parameters);
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  lVar1 = std::__cxx11::string::rfind((char *)&line,0x1c9c99);
  if (lVar1 == -1) {
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameters,"",(allocator<char> *)&key);
    InvalidMessage::InvalidMessage(pIVar3,&parameters);
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  std::__cxx11::string::substr((ulong)&parameters,(ulong)&line);
  std::__cxx11::string::operator=((string *)this,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  lVar1 = std::__cxx11::string::find((char)this,0x3f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&parameters,(ulong)this);
    std::__cxx11::string::substr((ulong)&key,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
    lVar1 = 0;
    while (lVar1 != -1) {
      lVar1 = std::__cxx11::string::find_first_of((char *)&parameters,0x1ca55f);
      if (lVar1 == -1) break;
      lVar1 = std::__cxx11::string::find_first_of((char *)&parameters,0x1c9900);
      std::__cxx11::string::substr((ulong)&key,(ulong)&parameters);
      std::__cxx11::string::substr((ulong)&value,(ulong)&parameters);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_parameters,&key);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
    }
    std::__cxx11::string::~string((string *)&parameters);
  }
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

EXCEPT(InvalidMessage) {
  clear();

  std::string::size_type eolPos = string.find("\r\n");
  if (eolPos == std::string::npos) {
    throw InvalidMessage();
  }
  std::string line = string.substr(0, eolPos);
  std::string::size_type getPos = line.find("GET ");
  if (getPos != 0) {
    throw InvalidMessage();
  }
  std::string::size_type httpPos = line.rfind("HTTP", std::string::npos);
  if (httpPos == std::string::npos) {
    throw InvalidMessage();
  }

  m_root = line.substr(getPos + 4, httpPos - 5);
  std::string::size_type paramPos = m_root.find_first_of('?');
  if (paramPos == std::string::npos) {
    return;
  }
  std::string parameters = m_root.substr(paramPos, m_root.size() - paramPos);
  m_root = m_root.substr(0, paramPos);
  paramPos = 0;

  while (paramPos != std::string::npos) {
    std::string::size_type sepPos = parameters.find_first_of("=", paramPos);
    if (sepPos == std::string::npos) {
      break;
    }
    std::string::size_type tempPos = paramPos;
    paramPos = parameters.find_first_of("&", paramPos + 1);
    std::string key = parameters.substr(tempPos + 1, sepPos - tempPos - 1);
    std::string value = parameters.substr(sepPos + 1, paramPos - sepPos - 1);
    m_parameters[key] = value;
  }
}